

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataQueryDatumSpecification.cpp
# Opt level: O1

int __thiscall
DIS::DataQueryDatumSpecification::getMarshalledSize(DataQueryDatumSpecification *this)

{
  int iVar1;
  pointer pUVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  UnsignedDISInteger listElement;
  UnsignedDISInteger local_40;
  
  pUVar2 = (this->_fixedDatumIDList).
           super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_fixedDatumIDList).
      super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>._M_impl.
      super__Vector_impl_data._M_finish == pUVar2) {
    iVar3 = 8;
  }
  else {
    iVar3 = 8;
    lVar5 = 8;
    uVar4 = 0;
    do {
      local_40._vptr_UnsignedDISInteger = (_func_int **)&PTR__UnsignedDISInteger_001b65e0;
      local_40._val = *(uint *)((long)&pUVar2->_vptr_UnsignedDISInteger + lVar5);
      iVar1 = UnsignedDISInteger::getMarshalledSize(&local_40);
      iVar3 = iVar3 + iVar1;
      UnsignedDISInteger::~UnsignedDISInteger(&local_40);
      uVar4 = uVar4 + 1;
      pUVar2 = (this->_fixedDatumIDList).
               super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x10;
    } while (uVar4 < (ulong)((long)(this->_fixedDatumIDList).
                                   super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2 >> 4));
  }
  pUVar2 = (this->_variableDatumIDList).
           super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_variableDatumIDList).
      super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>._M_impl.
      super__Vector_impl_data._M_finish != pUVar2) {
    lVar5 = 8;
    uVar4 = 0;
    do {
      local_40._vptr_UnsignedDISInteger = (_func_int **)&PTR__UnsignedDISInteger_001b65e0;
      local_40._val = *(uint *)((long)&pUVar2->_vptr_UnsignedDISInteger + lVar5);
      iVar1 = UnsignedDISInteger::getMarshalledSize(&local_40);
      iVar3 = iVar3 + iVar1;
      UnsignedDISInteger::~UnsignedDISInteger(&local_40);
      uVar4 = uVar4 + 1;
      pUVar2 = (this->_variableDatumIDList).
               super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x10;
    } while (uVar4 < (ulong)((long)(this->_variableDatumIDList).
                                   super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2 >> 4));
  }
  return iVar3;
}

Assistant:

int DataQueryDatumSpecification::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 4;  // _numberOfFixedDatums
   marshalSize = marshalSize + 4;  // _numberOfVariableDatums

   for(unsigned long long idx=0; idx < _fixedDatumIDList.size(); idx++)
   {
        UnsignedDISInteger listElement = _fixedDatumIDList[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }


   for(unsigned long long idx=0; idx < _variableDatumIDList.size(); idx++)
   {
        UnsignedDISInteger listElement = _variableDatumIDList[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}